

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O3

void __thiscall HttpReqThread::thread_main(HttpReqThread *this)

{
  char *__s;
  int iVar1;
  CVmMemorySource *this_00;
  size_t send_headers_len;
  char **location;
  char *reply_hdrs;
  char *loc;
  
  loc = (char *)0x0;
  location = &loc;
  if ((this->options & 1) == 0) {
    location = (char **)0x0;
  }
  this_00 = (CVmMemorySource *)operator_new(0x10);
  CVmMemorySource::CVmMemorySource(this_00,0x80);
  reply_hdrs = (char *)0x0;
  iVar1 = this->https;
  __s = this->hdrs;
  if (__s == (char *)0x0) {
    send_headers_len = 0;
  }
  else {
    send_headers_len = strlen(__s);
  }
  iVar1 = OS_HttpClient::request
                    ((uint)(iVar1 != 0),this->host,this->port,this->verb,this->resource,__s,
                     send_headers_len,this->body,(CVmDataSource *)this_00,&reply_hdrs,location,
                     (char *)0x0);
  if (iVar1 < 0) {
    (*(this_00->super_CVmDataSource)._vptr_CVmDataSource[1])(this_00);
    this_00 = (CVmMemorySource *)0x0;
  }
  post_result(this,iVar1,&this_00->super_CVmDataSource,reply_hdrs,loc);
  return;
}

Assistant:

void thread_main()
    {
        /* if they want redirections, set up to receive the location */
        char *loc = 0;
        char **locp = ((options & NetReqNoRedirect) != 0 ? &loc : 0);

        /* set up a memory stream object to hold the reply */
        CVmMemorySource *reply = new CVmMemorySource(128);

        /* no reply headers yet */
        char *reply_hdrs = 0;

        /* figure the request option flags */
        int rflags = 0;
        if (https)
            rflags |= OS_HttpClient::OptHTTPS;

        /* get the length of the custom headers, if we have any */
        size_t hdrs_len = (hdrs != 0 ? strlen(hdrs) : 0);

        /* send the request */
        int status = OS_HttpClient::request(
            rflags, host, port, verb, resource, hdrs, hdrs_len, body,
            reply, &reply_hdrs, locp, 0);
        
        /* 
         *   if the status is negative, a system-level error occurred, so
         *   there's no reply data - delete and forget the reply stream
         */
        if (status < 0)
        {
            delete reply;
            reply = 0;
        }
        
        /* 
         *   Always post a result event, even on failure, since the event is
         *   the way we transmit the status information back to the caller.
         *   Note that the event object takes ownership of the reply stream,
         *   headers string, and location string, and will free the
         *   underlying memory when the event object is deleted.
         */
        post_result(status, reply, reply_hdrs, loc);
    }